

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::updateClusters(btSoftBody *this)

{
  Node *pNVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  Cluster **ppCVar5;
  btVector3 *pbVar6;
  btVector3 *pbVar7;
  btScalar *pbVar8;
  Node **ppNVar9;
  long in_RDI;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 uVar10;
  undefined4 uVar11;
  btVector3 bVar12;
  btDbvtVolume bounds;
  int j_1;
  btVector3 mx;
  btVector3 mi;
  btVector3 x;
  Node *n_1;
  int j;
  btVector3 v;
  int i_2;
  btVector3 *b;
  btVector3 a;
  int i_1;
  btMatrix3x3 s;
  btMatrix3x3 r;
  btMatrix3x3 m;
  btScalar eps;
  int n;
  Cluster *c;
  int i;
  CProfileSample __profile;
  btMatrix3x3 *in_stack_fffffffffffff968;
  btTransform *in_stack_fffffffffffff970;
  undefined1 in_stack_fffffffffffff978 [16];
  undefined1 in_stack_fffffffffffff988 [16];
  btDbvtVolume *in_stack_fffffffffffff998;
  Cluster *in_stack_fffffffffffff9a0;
  btDbvt *this_00;
  btMatrix3x3 *in_stack_fffffffffffff9d0;
  undefined1 in_stack_fffffffffffffa08 [16];
  btScalar local_568;
  btScalar bStack_564;
  btScalar local_528;
  btScalar bStack_524;
  btScalar local_508;
  btScalar bStack_504;
  btScalar local_4d8;
  btScalar bStack_4d4;
  btScalar local_488;
  btScalar bStack_484;
  btScalar local_458;
  btScalar bStack_454;
  btScalar local_428;
  btScalar bStack_424;
  btScalar local_3f8;
  btScalar bStack_3f4;
  btScalar local_3c8;
  btScalar bStack_3c4;
  int local_304;
  int local_2b8;
  btScalar local_2b4;
  btScalar local_2b0;
  btScalar local_2ac;
  btVector3 local_2a8;
  btScalar local_298;
  btScalar local_294;
  btScalar local_290;
  btVector3 local_28c;
  float local_27c;
  undefined8 local_278;
  undefined8 local_270;
  undefined8 local_268;
  undefined8 uStack_260;
  float local_258;
  undefined8 local_254;
  undefined8 local_24c;
  btScalar local_244;
  btScalar bStack_240;
  undefined8 uStack_23c;
  btScalar local_234;
  btScalar bStack_230;
  undefined8 local_22c;
  btVector3 local_224;
  btVector3 local_214;
  int local_204;
  btScalar local_200;
  btScalar local_1fc;
  btScalar local_1f8;
  btVector3 local_1f4;
  btScalar local_1e4;
  btScalar local_1e0;
  btScalar local_1dc;
  btVector3 local_1d8 [7];
  btMatrix3x3 local_168;
  btVector3 local_138;
  btVector3 local_128;
  btVector3 local_118;
  btVector3 *local_108;
  btVector3 local_100;
  int local_f0;
  btScalar local_ec;
  btScalar bStack_e8;
  undefined8 local_e4;
  btScalar local_dc;
  btScalar local_d8;
  btScalar local_d4;
  btVector3 local_d0 [7];
  btMatrix3x3 local_60;
  undefined4 local_30;
  int local_2c;
  Cluster *local_28;
  int local_10;
  
  CProfileSample::CProfileSample
            ((CProfileSample *)in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968);
  for (local_10 = 0; iVar4 = local_10,
      iVar3 = btAlignedObjectArray<btSoftBody::Cluster_*>::size
                        ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8)),
      iVar4 < iVar3; local_10 = local_10 + 1) {
    ppCVar5 = btAlignedObjectArray<btSoftBody::Cluster_*>::operator[]
                        ((btAlignedObjectArray<btSoftBody::Cluster_*> *)(in_RDI + 0x5d8),local_10);
    local_28 = *ppCVar5;
    local_2c = btAlignedObjectArray<btSoftBody::Node_*>::size(&local_28->m_nodes);
    if (local_2c != 0) {
      local_30 = 0x38d1b717;
      btMatrix3x3::btMatrix3x3(in_stack_fffffffffffff978._8_8_);
      btMatrix3x3::btMatrix3x3(in_stack_fffffffffffff978._8_8_);
      btMatrix3x3::btMatrix3x3(in_stack_fffffffffffff978._8_8_);
      local_d4 = 0.0;
      local_d8 = 0.0;
      local_dc = 0.0;
      btVector3::btVector3(local_d0,&local_d4,&local_d8,&local_dc);
      pbVar6 = btMatrix3x3::operator[](&local_60,2);
      *(undefined8 *)pbVar6->m_floats = local_d0[0].m_floats._0_8_;
      *(undefined8 *)(pbVar6->m_floats + 2) = local_d0[0].m_floats._8_8_;
      pbVar7 = btMatrix3x3::operator[](&local_60,1);
      uVar2 = *(undefined8 *)(pbVar6->m_floats + 2);
      *(undefined8 *)pbVar7->m_floats = *(undefined8 *)pbVar6->m_floats;
      *(undefined8 *)(pbVar7->m_floats + 2) = uVar2;
      pbVar6 = btMatrix3x3::operator[](&local_60,0);
      uVar2 = *(undefined8 *)(pbVar7->m_floats + 2);
      *(undefined8 *)pbVar6->m_floats = *(undefined8 *)pbVar7->m_floats;
      *(undefined8 *)(pbVar6->m_floats + 2) = uVar2;
      pbVar6 = btMatrix3x3::operator[](&local_60,0);
      pbVar8 = btVector3::operator_cast_to_float_(pbVar6);
      *pbVar8 = 0.0001;
      pbVar6 = btMatrix3x3::operator[](&local_60,1);
      pbVar8 = btVector3::operator_cast_to_float_(pbVar6);
      pbVar8[1] = 0.0002;
      pbVar6 = btMatrix3x3::operator[](&local_60,2);
      pbVar8 = btVector3::operator_cast_to_float_(pbVar6);
      pbVar8[2] = 0.00029999999;
      bVar12 = clusterCom(in_stack_fffffffffffff9a0);
      local_e4 = bVar12.m_floats._8_8_;
      local_3c8 = bVar12.m_floats[0];
      bStack_3c4 = bVar12.m_floats[1];
      local_ec = local_3c8;
      bStack_e8 = bStack_3c4;
      *(long *)(local_28->m_com).m_floats = bVar12.m_floats._0_8_;
      *(undefined8 *)((local_28->m_com).m_floats + 2) = local_e4;
      for (local_f0 = 0; iVar4 = local_f0,
          iVar3 = btAlignedObjectArray<btSoftBody::Node_*>::size(&local_28->m_nodes), iVar4 < iVar3;
          local_f0 = local_f0 + 1) {
        btAlignedObjectArray<btSoftBody::Node_*>::operator[](&local_28->m_nodes,local_f0);
        bVar12 = operator-(in_stack_fffffffffffff978._8_8_,in_stack_fffffffffffff978._0_8_);
        local_100.m_floats._8_8_ = bVar12.m_floats._8_8_;
        local_3f8 = bVar12.m_floats[0];
        bStack_3f4 = bVar12.m_floats[1];
        local_100.m_floats[0] = local_3f8;
        local_100.m_floats[1] = bStack_3f4;
        local_108 = btAlignedObjectArray<btVector3>::operator[](&local_28->m_framerefs,local_f0);
        btVector3::operator_cast_to_float_(&local_100);
        bVar12 = ::operator*((btScalar *)in_stack_fffffffffffff970,in_stack_fffffffffffff968->m_el);
        local_118.m_floats._8_8_ = bVar12.m_floats._8_8_;
        local_428 = bVar12.m_floats[0];
        bStack_424 = bVar12.m_floats[1];
        local_118.m_floats[0] = local_428;
        local_118.m_floats[1] = bStack_424;
        pbVar6 = btMatrix3x3::operator[](&local_60,0);
        btVector3::operator+=(pbVar6,&local_118);
        btVector3::operator_cast_to_float_(&local_100);
        bVar12 = ::operator*((btScalar *)in_stack_fffffffffffff970,in_stack_fffffffffffff968->m_el);
        local_128.m_floats._8_8_ = bVar12.m_floats._8_8_;
        local_458 = bVar12.m_floats[0];
        bStack_454 = bVar12.m_floats[1];
        local_128.m_floats[0] = local_458;
        local_128.m_floats[1] = bStack_454;
        pbVar6 = btMatrix3x3::operator[](&local_60,1);
        btVector3::operator+=(pbVar6,&local_128);
        btVector3::operator_cast_to_float_(&local_100);
        bVar12 = ::operator*((btScalar *)in_stack_fffffffffffff970,in_stack_fffffffffffff968->m_el);
        local_138.m_floats._8_8_ = bVar12.m_floats._8_8_;
        local_488 = bVar12.m_floats[0];
        bStack_484 = bVar12.m_floats[1];
        local_138.m_floats[0] = local_488;
        local_138.m_floats[1] = bStack_484;
        pbVar6 = btMatrix3x3::operator[](&local_60,2);
        btVector3::operator+=(pbVar6,&local_138);
      }
      PolarDecompose(in_stack_fffffffffffff978._8_8_,in_stack_fffffffffffff978._0_8_,
                     &in_stack_fffffffffffff970->m_basis);
      btTransform::setOrigin(&local_28->m_framexform,&local_28->m_com);
      btTransform::setBasis(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
      btTransform::getBasis(&local_28->m_framexform);
      ::operator*(in_stack_fffffffffffffa08._8_8_,in_stack_fffffffffffffa08._0_8_);
      btTransform::getBasis(&local_28->m_framexform);
      btMatrix3x3::transpose(in_stack_fffffffffffff9d0);
      ::operator*(in_stack_fffffffffffffa08._8_8_,in_stack_fffffffffffffa08._0_8_);
      btMatrix3x3::operator=(&local_28->m_invwi,&local_168);
      local_1dc = 0.0;
      local_1e0 = 0.0;
      local_1e4 = 0.0;
      btVector3::btVector3(local_1d8,&local_1dc,&local_1e0,&local_1e4);
      *(undefined8 *)(local_28->m_lv).m_floats = local_1d8[0].m_floats._0_8_;
      *(undefined8 *)((local_28->m_lv).m_floats + 2) = local_1d8[0].m_floats._8_8_;
      local_1f8 = 0.0;
      local_1fc = 0.0;
      local_200 = 0.0;
      btVector3::btVector3(&local_1f4,&local_1f8,&local_1fc,&local_200);
      *(undefined8 *)(local_28->m_av).m_floats = local_1f4.m_floats._0_8_;
      *(undefined8 *)((local_28->m_av).m_floats + 2) = local_1f4.m_floats._8_8_;
      for (local_204 = 0; local_204 < local_2c; local_204 = local_204 + 1) {
        btAlignedObjectArray<btSoftBody::Node_*>::operator[](&local_28->m_nodes,local_204);
        btAlignedObjectArray<float>::operator[](&local_28->m_masses,local_204);
        bVar12 = ::operator*(in_stack_fffffffffffff978._8_8_,in_stack_fffffffffffff978._0_8_);
        local_214.m_floats._8_8_ = bVar12.m_floats._8_8_;
        local_4d8 = bVar12.m_floats[0];
        bStack_4d4 = bVar12.m_floats[1];
        local_214.m_floats[0] = local_4d8;
        local_214.m_floats[1] = bStack_4d4;
        btVector3::operator+=(&local_28->m_lv,&local_214);
        btAlignedObjectArray<btSoftBody::Node_*>::operator[](&local_28->m_nodes,local_204);
        bVar12 = operator-(in_stack_fffffffffffff978._8_8_,in_stack_fffffffffffff978._0_8_);
        local_22c = bVar12.m_floats._8_8_;
        local_508 = bVar12.m_floats[0];
        bStack_504 = bVar12.m_floats[1];
        local_234 = local_508;
        bStack_230 = bStack_504;
        bVar12 = btCross((btVector3 *)in_stack_fffffffffffff970,in_stack_fffffffffffff968->m_el);
        local_224.m_floats._8_8_ = bVar12.m_floats._8_8_;
        local_528 = bVar12.m_floats[0];
        bStack_524 = bVar12.m_floats[1];
        local_224.m_floats[0] = local_528;
        local_224.m_floats[1] = bStack_524;
        btVector3::operator+=(&local_28->m_av,&local_224);
      }
      bVar12 = ::operator*((btScalar *)in_stack_fffffffffffff970,in_stack_fffffffffffff968->m_el);
      local_24c = bVar12.m_floats._8_8_;
      local_254 = bVar12.m_floats._0_8_;
      local_258 = 1.0 - local_28->m_ldamping;
      bVar12 = ::operator*(in_stack_fffffffffffff978._8_8_,in_stack_fffffffffffff978._0_8_);
      uStack_23c = bVar12.m_floats._8_8_;
      local_568 = bVar12.m_floats[0];
      bStack_564 = bVar12.m_floats[1];
      local_244 = local_568;
      bStack_240 = bStack_564;
      *(long *)(local_28->m_lv).m_floats = bVar12.m_floats._0_8_;
      *(undefined8 *)((local_28->m_lv).m_floats + 2) = uStack_23c;
      bVar12 = ::operator*(in_stack_fffffffffffff978._8_8_,in_stack_fffffffffffff978._0_8_);
      local_270 = bVar12.m_floats._8_8_;
      local_278 = bVar12.m_floats._0_8_;
      local_27c = 1.0 - local_28->m_adamping;
      bVar12 = ::operator*(in_stack_fffffffffffff978._8_8_,in_stack_fffffffffffff978._0_8_);
      uStack_260 = bVar12.m_floats._8_8_;
      local_268 = bVar12.m_floats._0_8_;
      *(undefined8 *)(local_28->m_av).m_floats = local_268;
      *(undefined8 *)((local_28->m_av).m_floats + 2) = uStack_260;
      local_290 = 0.0;
      local_294 = 0.0;
      local_298 = 0.0;
      btVector3::btVector3(&local_28c,&local_290,&local_294,&local_298);
      *(undefined8 *)local_28->m_vimpulses[1].m_floats = local_28c.m_floats._0_8_;
      *(undefined8 *)(local_28->m_vimpulses[1].m_floats + 2) = local_28c.m_floats._8_8_;
      uVar2 = *(undefined8 *)(local_28->m_vimpulses[1].m_floats + 2);
      *(undefined8 *)local_28->m_vimpulses[0].m_floats =
           *(undefined8 *)local_28->m_vimpulses[1].m_floats;
      *(undefined8 *)(local_28->m_vimpulses[0].m_floats + 2) = uVar2;
      local_2ac = 0.0;
      local_2b0 = 0.0;
      local_2b4 = 0.0;
      btVector3::btVector3(&local_2a8,&local_2ac,&local_2b0,&local_2b4);
      *(undefined8 *)local_28->m_dimpulses[1].m_floats = local_2a8.m_floats._0_8_;
      *(undefined8 *)(local_28->m_dimpulses[1].m_floats + 2) = local_2a8.m_floats._8_8_;
      *(undefined8 *)local_28->m_dimpulses[0].m_floats =
           *(undefined8 *)local_28->m_dimpulses[1].m_floats;
      *(undefined8 *)(local_28->m_dimpulses[0].m_floats + 2) =
           *(undefined8 *)(local_28->m_dimpulses[1].m_floats + 2);
      local_28->m_nvimpulses = 0;
      local_28->m_ndimpulses = 0;
      uVar10 = 0;
      uVar11 = 0;
      if (0.0 < local_28->m_matching) {
        for (local_2b8 = 0;
            iVar4 = btAlignedObjectArray<btSoftBody::Node_*>::size(&local_28->m_nodes),
            local_2b8 < iVar4; local_2b8 = local_2b8 + 1) {
          ppNVar9 = btAlignedObjectArray<btSoftBody::Node_*>::operator[]
                              (&local_28->m_nodes,local_2b8);
          pNVar1 = *ppNVar9;
          btAlignedObjectArray<btVector3>::operator[](&local_28->m_framerefs,local_2b8);
          bVar12 = btTransform::operator*(in_stack_fffffffffffff970,in_stack_fffffffffffff968->m_el)
          ;
          in_stack_fffffffffffffa08._8_4_ = uVar10;
          in_stack_fffffffffffffa08._0_8_ = bVar12.m_floats._8_8_;
          in_stack_fffffffffffffa08._12_4_ = uVar11;
          bVar12 = Lerp<btVector3>((btVector3 *)in_stack_fffffffffffff9a0,
                                   &in_stack_fffffffffffff998->mi,in_stack_fffffffffffff988._12_4_);
          *(long *)(pNVar1->m_x).m_floats = bVar12.m_floats._0_8_;
          *(long *)((pNVar1->m_x).m_floats + 2) = bVar12.m_floats._8_8_;
          uVar10 = extraout_XMM0_Dc;
          uVar11 = extraout_XMM0_Dd;
        }
      }
      if ((local_28->m_collide & 1U) != 0) {
        btAlignedObjectArray<btSoftBody::Node_*>::operator[](&local_28->m_nodes,0);
        for (local_304 = 1; local_304 < local_2c; local_304 = local_304 + 1) {
          btAlignedObjectArray<btSoftBody::Node_*>::operator[](&local_28->m_nodes,local_304);
          btVector3::setMin(in_stack_fffffffffffff978._8_8_,in_stack_fffffffffffff978._0_8_);
          in_stack_fffffffffffff9d0 =
               (btMatrix3x3 *)
               btAlignedObjectArray<btSoftBody::Node_*>::operator[](&local_28->m_nodes,local_304);
          btVector3::setMax(in_stack_fffffffffffff978._8_8_,in_stack_fffffffffffff978._0_8_);
        }
        btDbvtAabbMm::FromMM(in_stack_fffffffffffff978._8_8_,in_stack_fffffffffffff978._0_8_);
        if (local_28->m_leaf == (btDbvtNode *)0x0) {
          in_stack_fffffffffffff970 =
               (btTransform *)
               btDbvt::insert(in_stack_fffffffffffff978._8_8_,in_stack_fffffffffffff978._0_8_,
                              in_stack_fffffffffffff970);
          local_28->m_leaf = (btDbvtNode *)in_stack_fffffffffffff970;
        }
        else {
          in_stack_fffffffffffff998 = (btDbvtVolume *)(in_RDI + 0x578);
          in_stack_fffffffffffff9a0 = (Cluster *)local_28->m_leaf;
          bVar12 = ::operator*((btVector3 *)in_stack_fffffffffffff978._8_8_,
                               (btScalar *)in_stack_fffffffffffff978._0_8_);
          this_00 = bVar12.m_floats._8_8_;
          uVar10 = extraout_XMM0_Dc_00;
          uVar11 = extraout_XMM0_Dd_00;
          bVar12 = ::operator*(in_stack_fffffffffffff978._8_8_,in_stack_fffffffffffff978._0_8_);
          in_stack_fffffffffffff978._8_4_ = uVar10;
          in_stack_fffffffffffff978._0_8_ = bVar12.m_floats._8_8_;
          in_stack_fffffffffffff978._12_4_ = uVar11;
          in_stack_fffffffffffff988._8_4_ = extraout_XMM0_Dc_01;
          in_stack_fffffffffffff988._0_8_ = bVar12.m_floats._0_8_;
          in_stack_fffffffffffff988._12_4_ = extraout_XMM0_Dd_01;
          btDbvt::update(this_00,(btDbvtNode *)in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,
                         in_stack_fffffffffffff988._8_8_,bVar12.m_floats[1]);
        }
      }
    }
  }
  CProfileSample::~CProfileSample((CProfileSample *)0x2730f8);
  return;
}

Assistant:

void					btSoftBody::updateClusters()
{
	BT_PROFILE("UpdateClusters");
	int i;

	for(i=0;i<m_clusters.size();++i)
	{
		btSoftBody::Cluster&	c=*m_clusters[i];
		const int				n=c.m_nodes.size();
		//const btScalar			invn=1/(btScalar)n;
		if(n)
		{
			/* Frame				*/ 
			const btScalar	eps=btScalar(0.0001);
			btMatrix3x3		m,r,s;
			m[0]=m[1]=m[2]=btVector3(0,0,0);
			m[0][0]=eps*1;
			m[1][1]=eps*2;
			m[2][2]=eps*3;
			c.m_com=clusterCom(&c);
			for(int i=0;i<c.m_nodes.size();++i)
			{
				const btVector3		a=c.m_nodes[i]->m_x-c.m_com;
				const btVector3&	b=c.m_framerefs[i];
				m[0]+=a[0]*b;m[1]+=a[1]*b;m[2]+=a[2]*b;
			}
			PolarDecompose(m,r,s);
			c.m_framexform.setOrigin(c.m_com);
			c.m_framexform.setBasis(r);		
			/* Inertia			*/ 
#if 1/* Constant	*/ 
			c.m_invwi=c.m_framexform.getBasis()*c.m_locii*c.m_framexform.getBasis().transpose();
#else
#if 0/* Sphere	*/ 
			const btScalar	rk=(2*c.m_extents.length2())/(5*c.m_imass);
			const btVector3	inertia(rk,rk,rk);
			const btVector3	iin(btFabs(inertia[0])>SIMD_EPSILON?1/inertia[0]:0,
				btFabs(inertia[1])>SIMD_EPSILON?1/inertia[1]:0,
				btFabs(inertia[2])>SIMD_EPSILON?1/inertia[2]:0);

			c.m_invwi=c.m_xform.getBasis().scaled(iin)*c.m_xform.getBasis().transpose();
#else/* Actual	*/ 		
			c.m_invwi[0]=c.m_invwi[1]=c.m_invwi[2]=btVector3(0,0,0);
			for(int i=0;i<n;++i)
			{
				const btVector3	k=c.m_nodes[i]->m_x-c.m_com;
				const btVector3		q=k*k;
				const btScalar		m=1/c.m_nodes[i]->m_im;
				c.m_invwi[0][0]	+=	m*(q[1]+q[2]);
				c.m_invwi[1][1]	+=	m*(q[0]+q[2]);
				c.m_invwi[2][2]	+=	m*(q[0]+q[1]);
				c.m_invwi[0][1]	-=	m*k[0]*k[1];
				c.m_invwi[0][2]	-=	m*k[0]*k[2];
				c.m_invwi[1][2]	-=	m*k[1]*k[2];
			}
			c.m_invwi[1][0]=c.m_invwi[0][1];
			c.m_invwi[2][0]=c.m_invwi[0][2];
			c.m_invwi[2][1]=c.m_invwi[1][2];
			c.m_invwi=c.m_invwi.inverse();
#endif
#endif
			/* Velocities			*/ 
			c.m_lv=btVector3(0,0,0);
			c.m_av=btVector3(0,0,0);
			{
				int i;

				for(i=0;i<n;++i)
				{
					const btVector3	v=c.m_nodes[i]->m_v*c.m_masses[i];
					c.m_lv	+=	v;
					c.m_av	+=	btCross(c.m_nodes[i]->m_x-c.m_com,v);
				}
			}
			c.m_lv=c.m_imass*c.m_lv*(1-c.m_ldamping);
			c.m_av=c.m_invwi*c.m_av*(1-c.m_adamping);
			c.m_vimpulses[0]	=
				c.m_vimpulses[1]	= btVector3(0,0,0);
			c.m_dimpulses[0]	=
				c.m_dimpulses[1]	= btVector3(0,0,0);
			c.m_nvimpulses		= 0;
			c.m_ndimpulses		= 0;
			/* Matching				*/ 
			if(c.m_matching>0)
			{
				for(int j=0;j<c.m_nodes.size();++j)
				{
					Node&			n=*c.m_nodes[j];
					const btVector3	x=c.m_framexform*c.m_framerefs[j];
					n.m_x=Lerp(n.m_x,x,c.m_matching);
				}
			}			
			/* Dbvt					*/ 
			if(c.m_collide)
			{
				btVector3	mi=c.m_nodes[0]->m_x;
				btVector3	mx=mi;
				for(int j=1;j<n;++j)
				{
					mi.setMin(c.m_nodes[j]->m_x);
					mx.setMax(c.m_nodes[j]->m_x);
				}			
				ATTRIBUTE_ALIGNED16(btDbvtVolume)	bounds=btDbvtVolume::FromMM(mi,mx);
				if(c.m_leaf)
					m_cdbvt.update(c.m_leaf,bounds,c.m_lv*m_sst.sdt*3,m_sst.radmrg);
				else
					c.m_leaf=m_cdbvt.insert(bounds,&c);
			}
		}
	}


}